

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementTetraCorot_4::ComputeInternalForces
          (ChElementTetraCorot_4 *this,ChVectorDynamic<> *Fi)

{
  double *pdVar1;
  ChMatrixDynamic<> *lhs;
  double *pdVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  pointer psVar12;
  element_type *peVar13;
  element_type *peVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  ulong uVar22;
  Index IVar23;
  uint uVar24;
  ulong uVar25;
  char *pcVar26;
  ActualDstType actualDst;
  ulong uVar27;
  uint uVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ChVectorDynamic<> FiK_local;
  ChVectorDynamic<> displ;
  ChMatrixDynamic<> FiR_local;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_d8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_c8;
  undefined1 local_b8 [40];
  double *local_90;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pPStack_88;
  Index local_80;
  ChVectorDynamic<> *local_78;
  long local_70;
  ulong local_68;
  long local_60;
  ChMatrixRef local_58;
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    __assert_fail("Fi.size() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementTetraCorot_4.cpp"
                  ,0xfa,
                  "virtual void chrono::fea::ChElementTetraCorot_4::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  local_c8.m_storage.m_data = (double *)0x0;
  local_c8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_c8,0xc);
  (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[9])(this,&local_c8);
  if ((this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
      m_storage.m_cols != local_c8.m_storage.m_rows) {
    pcVar26 = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
    ;
    goto LAB_0069cec9;
  }
  local_d8.m_storage.m_data = (double *)0x0;
  local_d8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_d8,
             (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows,1);
  uVar25 = (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
           m_storage.m_rows;
  if (local_d8.m_storage.m_rows != uVar25) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_d8,uVar25,1);
    uVar25 = local_d8.m_storage.m_rows;
  }
  lhs = &this->StiffnessMatrix;
  if (-1 < (long)uVar25) {
    if (uVar25 != 0) {
      memset(local_d8.m_storage.m_data,0,uVar25 << 3);
    }
    local_b8._0_8_ = 0x3ff0000000000000;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_d8,lhs,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_c8,(Scalar *)local_b8);
    IVar23 = local_c8.m_storage.m_rows;
    pdVar2 = local_c8.m_storage.m_data;
    psVar12 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar13 = (psVar12->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    dVar3 = *(double *)&peVar13->field_0x40;
    auVar43._8_8_ = *(undefined8 *)&peVar13->field_0x38;
    auVar43._0_8_ = *(undefined8 *)&peVar13->field_0x38;
    auVar47._8_8_ = *(undefined8 *)&peVar13->field_0x48;
    auVar47._0_8_ = *(undefined8 *)&peVar13->field_0x48;
    auVar34._0_8_ =
         dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar34._8_8_ =
         dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar39._8_8_ = 0;
    auVar39._0_8_ =
         dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar39 = vfmadd231sd_fma(auVar39,auVar43,auVar4);
    auVar4 = vfmadd231pd_fma(auVar34,auVar43,
                             *(undefined1 (*) [16])
                              (this->super_ChElementCorotational).A.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar5 = vfmadd231sd_fma(auVar39,auVar47,auVar5);
    local_b8._0_16_ =
         vfmadd231pd_fma(auVar4,auVar47,
                         *(undefined1 (*) [16])
                          ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>
                           .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6));
    local_b8._16_8_ = auVar5._0_8_;
    local_78 = Fi;
    if (local_c8.m_storage.m_rows < 3) goto LAB_0069ce29;
    uVar28 = 3;
    if (((ulong)local_c8.m_storage.m_data & 7) == 0) {
      uVar24 = -((uint)((ulong)local_c8.m_storage.m_data >> 3) & 0x1fffffff) & 7;
      if (uVar24 < 3) {
        uVar28 = uVar24;
      }
      if (uVar24 != 0) goto LAB_0069c8dc;
    }
    else {
LAB_0069c8dc:
      memcpy(local_c8.m_storage.m_data,local_b8,(ulong)(uVar28 * 8));
    }
    if (uVar28 < 3) {
      uVar25 = (ulong)(uVar28 << 3);
      memcpy((void *)((long)pdVar2 + uVar25),local_b8 + uVar25,0x18 - uVar25);
    }
    peVar13 = psVar12[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    dVar3 = *(double *)&peVar13->field_0x40;
    auVar44._8_8_ = *(undefined8 *)&peVar13->field_0x38;
    auVar44._0_8_ = *(undefined8 *)&peVar13->field_0x38;
    auVar48._8_8_ = *(undefined8 *)&peVar13->field_0x48;
    auVar48._0_8_ = *(undefined8 *)&peVar13->field_0x48;
    auVar35._0_8_ =
         dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar35._8_8_ =
         dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar40._8_8_ = 0;
    auVar40._0_8_ =
         dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar5 = vfmadd231sd_fma(auVar40,auVar44,auVar6);
    auVar4 = vfmadd231pd_fma(auVar35,auVar44,
                             *(undefined1 (*) [16])
                              (this->super_ChElementCorotational).A.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar5 = vfmadd231sd_fma(auVar5,auVar48,auVar7);
    local_b8._0_16_ =
         vfmadd231pd_fma(auVar4,auVar48,
                         *(undefined1 (*) [16])
                          ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>
                           .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6));
    local_b8._16_8_ = auVar5._0_8_;
    if ((ulong)IVar23 < 6) goto LAB_0069ce29;
    pdVar1 = pdVar2 + 3;
    uVar28 = 3;
    if (((ulong)pdVar1 & 7) == 0) {
      uVar24 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
      if (uVar24 < 3) {
        uVar28 = uVar24;
      }
      if (uVar24 != 0) goto LAB_0069c98a;
    }
    else {
LAB_0069c98a:
      memcpy(pdVar1,local_b8,(ulong)(uVar28 * 8));
    }
    if (uVar28 < 3) {
      uVar25 = (ulong)(uVar28 << 3);
      memcpy((void *)((long)pdVar2 + uVar25 + 0x18),local_b8 + uVar25,0x18 - uVar25);
    }
    peVar13 = psVar12[2].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    dVar3 = *(double *)&peVar13->field_0x40;
    auVar45._8_8_ = *(undefined8 *)&peVar13->field_0x38;
    auVar45._0_8_ = *(undefined8 *)&peVar13->field_0x38;
    auVar49._8_8_ = *(undefined8 *)&peVar13->field_0x48;
    auVar49._0_8_ = *(undefined8 *)&peVar13->field_0x48;
    auVar36._0_8_ =
         dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar36._8_8_ =
         dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar41._8_8_ = 0;
    auVar41._0_8_ =
         dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar5 = vfmadd231sd_fma(auVar41,auVar45,auVar8);
    auVar4 = vfmadd231pd_fma(auVar36,auVar45,
                             *(undefined1 (*) [16])
                              (this->super_ChElementCorotational).A.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar5 = vfmadd231sd_fma(auVar5,auVar49,auVar9);
    local_b8._0_16_ =
         vfmadd231pd_fma(auVar4,auVar49,
                         *(undefined1 (*) [16])
                          ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>
                           .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6));
    local_b8._16_8_ = auVar5._0_8_;
    if ((ulong)IVar23 < 9) goto LAB_0069ce29;
    pdVar1 = pdVar2 + 6;
    uVar28 = 3;
    if (((ulong)pdVar1 & 7) == 0) {
      uVar24 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
      if (uVar24 < 3) {
        uVar28 = uVar24;
      }
      if (uVar24 != 0) goto LAB_0069ca35;
    }
    else {
LAB_0069ca35:
      memcpy(pdVar1,local_b8,(ulong)(uVar28 * 8));
    }
    if (uVar28 < 3) {
      uVar25 = (ulong)(uVar28 << 3);
      memcpy((void *)((long)pdVar2 + uVar25 + 0x30),local_b8 + uVar25,0x18 - uVar25);
    }
    peVar13 = psVar12[3].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    dVar3 = *(double *)&peVar13->field_0x40;
    auVar46._8_8_ = *(undefined8 *)&peVar13->field_0x38;
    auVar46._0_8_ = *(undefined8 *)&peVar13->field_0x38;
    auVar50._8_8_ = *(undefined8 *)&peVar13->field_0x48;
    auVar50._0_8_ = *(undefined8 *)&peVar13->field_0x48;
    auVar37._0_8_ =
         dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar37._8_8_ =
         dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar42._8_8_ = 0;
    auVar42._0_8_ =
         dVar3 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar5 = vfmadd231sd_fma(auVar42,auVar46,auVar10);
    auVar4 = vfmadd231pd_fma(auVar37,auVar46,
                             *(undefined1 (*) [16])
                              (this->super_ChElementCorotational).A.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar5 = vfmadd231sd_fma(auVar5,auVar50,auVar11);
    local_b8._0_16_ =
         vfmadd231pd_fma(auVar4,auVar50,
                         *(undefined1 (*) [16])
                          ((this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>
                           .super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 6));
    local_b8._16_8_ = auVar5._0_8_;
    if ((ulong)IVar23 < 0xc) {
LAB_0069ce29:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    pdVar1 = pdVar2 + 9;
    uVar28 = 3;
    if (((ulong)pdVar1 & 7) == 0) {
      uVar24 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
      if (uVar24 < 3) {
        uVar28 = uVar24;
      }
      if (uVar24 != 0) goto LAB_0069cae0;
    }
    else {
LAB_0069cae0:
      memcpy(pdVar1,local_b8,(ulong)(uVar28 * 8));
    }
    if (uVar28 < 3) {
      uVar25 = (ulong)(uVar28 << 3);
      memcpy((void *)((long)pdVar2 + uVar25 + 0x48),local_b8 + uVar25,0x18 - uVar25);
    }
    uVar25 = (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols;
    uVar27 = (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
    if ((long)(uVar25 | uVar27) < 0) {
      pcVar26 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_0069ceaa;
    }
    local_b8._24_8_ =
         ((this->Material).
          super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         damping_K;
    local_b8._8_8_ = uVar27;
    pPStack_88 = &local_c8;
    local_b8._16_8_ = uVar25;
    local_b8._32_8_ = lhs;
    if (uVar25 != IVar23) {
      pcVar26 = 
      "Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
      ;
LAB_0069cec9:
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar26);
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_70,
               (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)local_b8);
    if (-1 < local_c8.m_storage.m_rows) {
      peVar14 = (this->Material).
                super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      uVar25 = local_c8.m_storage.m_rows & 0x7ffffffffffffff8;
      auVar38._8_8_ = 0;
      auVar38._0_8_ =
           this->Volume * (peVar14->super_ChContinuumMaterial).density * 0.25 * peVar14->damping_M;
      if (7 < (ulong)local_c8.m_storage.m_rows) {
        auVar29 = vbroadcastsd_avx512f(auVar38);
        uVar27 = 0;
        do {
          auVar30 = vmulpd_avx512f(auVar29,*(undefined1 (*) [64])
                                            (local_c8.m_storage.m_data + uVar27));
          *(undefined1 (*) [64])(local_c8.m_storage.m_data + uVar27) = auVar30;
          uVar27 = uVar27 + 8;
        } while (uVar27 < uVar25);
      }
      if ((long)uVar25 < local_c8.m_storage.m_rows) {
        auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar30 = vbroadcastsd_avx512f(auVar38);
        uVar27 = 0;
        auVar31 = vpbroadcastq_avx512f();
        do {
          auVar32 = vpbroadcastq_avx512f();
          auVar32 = vporq_avx512f(auVar32,auVar29);
          uVar22 = vpcmpuq_avx512f(auVar32,auVar31,2);
          pdVar2 = local_c8.m_storage.m_data + uVar25 + uVar27;
          auVar32._8_8_ = (ulong)((byte)(uVar22 >> 1) & 1) * (long)pdVar2[1];
          auVar32._0_8_ = (ulong)((byte)uVar22 & 1) * (long)*pdVar2;
          auVar32._16_8_ = (ulong)((byte)(uVar22 >> 2) & 1) * (long)pdVar2[2];
          auVar32._24_8_ = (ulong)((byte)(uVar22 >> 3) & 1) * (long)pdVar2[3];
          auVar32._32_8_ = (ulong)((byte)(uVar22 >> 4) & 1) * (long)pdVar2[4];
          auVar32._40_8_ = (ulong)((byte)(uVar22 >> 5) & 1) * (long)pdVar2[5];
          auVar32._48_8_ = (ulong)((byte)(uVar22 >> 6) & 1) * (long)pdVar2[6];
          auVar32._56_8_ = (uVar22 >> 7) * (long)pdVar2[7];
          auVar32 = vmulpd_avx512f(auVar30,auVar32);
          pdVar2 = local_c8.m_storage.m_data + uVar25 + uVar27;
          bVar15 = (bool)((byte)uVar22 & 1);
          bVar16 = (bool)((byte)(uVar22 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar22 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar22 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar22 >> 4) & 1);
          bVar20 = (bool)((byte)(uVar22 >> 5) & 1);
          bVar21 = (bool)((byte)(uVar22 >> 6) & 1);
          *pdVar2 = (double)((ulong)bVar15 * auVar32._0_8_ | (ulong)!bVar15 * (long)*pdVar2);
          pdVar2[1] = (double)((ulong)bVar16 * auVar32._8_8_ | (ulong)!bVar16 * (long)pdVar2[1]);
          pdVar2[2] = (double)((ulong)bVar17 * auVar32._16_8_ | (ulong)!bVar17 * (long)pdVar2[2]);
          pdVar2[3] = (double)((ulong)bVar18 * auVar32._24_8_ | (ulong)!bVar18 * (long)pdVar2[3]);
          pdVar2[4] = (double)((ulong)bVar19 * auVar32._32_8_ | (ulong)!bVar19 * (long)pdVar2[4]);
          pdVar2[5] = (double)((ulong)bVar20 * auVar32._40_8_ | (ulong)!bVar20 * (long)pdVar2[5]);
          pdVar2[6] = (double)((ulong)bVar21 * auVar32._48_8_ | (ulong)!bVar21 * (long)pdVar2[6]);
          pdVar2[7] = (double)((uVar22 >> 7) * auVar32._56_8_ |
                              (ulong)!SUB81(uVar22 >> 7,0) * (long)pdVar2[7]);
          uVar27 = uVar27 + 8;
        } while ((((uint)local_c8.m_storage.m_rows & 7) + 7 & 0xfffffff8) != uVar27);
      }
      if ((local_68 == local_c8.m_storage.m_rows) && (local_60 == 1)) {
        if (local_c8.m_storage.m_rows == 0) {
          if (local_d8.m_storage.m_rows == 0) goto LAB_0069ccd7;
        }
        else {
          uVar27 = 0;
          do {
            *(double *)(local_70 + uVar27 * 8) =
                 local_c8.m_storage.m_data[uVar27] + *(double *)(local_70 + uVar27 * 8);
            uVar27 = uVar27 + 1;
          } while (local_c8.m_storage.m_rows != uVar27);
          if (local_d8.m_storage.m_rows == local_c8.m_storage.m_rows) {
            uVar27 = 0;
            do {
              local_d8.m_storage.m_data[uVar27] =
                   *(double *)(local_70 + uVar27 * 8) + local_d8.m_storage.m_data[uVar27];
              uVar27 = uVar27 + 1;
            } while (local_c8.m_storage.m_rows != uVar27);
            if (7 < (ulong)local_c8.m_storage.m_rows) {
              auVar29 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
              uVar27 = 0;
              do {
                auVar30 = vxorpd_avx512dq(auVar29,*(undefined1 (*) [64])
                                                   (local_d8.m_storage.m_data + uVar27));
                *(undefined1 (*) [64])(local_d8.m_storage.m_data + uVar27) = auVar30;
                uVar27 = uVar27 + 8;
              } while (uVar27 < uVar25);
            }
LAB_0069ccd7:
            if ((long)uVar25 < local_c8.m_storage.m_rows) {
              auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar30 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
              uVar25 = 0;
              auVar31 = vpbroadcastq_avx512f();
              do {
                auVar32 = vpbroadcastq_avx512f();
                auVar32 = vporq_avx512f(auVar32,auVar29);
                uVar27 = vpcmpuq_avx512f(auVar32,auVar31,2);
                pdVar2 = local_d8.m_storage.m_data +
                         ((ulong)local_c8.m_storage.m_rows >> 3) * 8 + uVar25;
                auVar33._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * (long)pdVar2[1];
                auVar33._0_8_ = (ulong)((byte)uVar27 & 1) * (long)*pdVar2;
                auVar33._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * (long)pdVar2[2];
                auVar33._24_8_ = (ulong)((byte)(uVar27 >> 3) & 1) * (long)pdVar2[3];
                auVar33._32_8_ = (ulong)((byte)(uVar27 >> 4) & 1) * (long)pdVar2[4];
                auVar33._40_8_ = (ulong)((byte)(uVar27 >> 5) & 1) * (long)pdVar2[5];
                auVar33._48_8_ = (ulong)((byte)(uVar27 >> 6) & 1) * (long)pdVar2[6];
                auVar33._56_8_ = (uVar27 >> 7) * (long)pdVar2[7];
                auVar32 = vxorpd_avx512dq(auVar33,auVar30);
                pdVar2 = local_d8.m_storage.m_data +
                         ((ulong)local_c8.m_storage.m_rows >> 3) * 8 + uVar25;
                bVar15 = (bool)((byte)uVar27 & 1);
                bVar16 = (bool)((byte)(uVar27 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar27 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar27 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar27 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar27 >> 5) & 1);
                bVar21 = (bool)((byte)(uVar27 >> 6) & 1);
                *pdVar2 = (double)((ulong)bVar15 * auVar32._0_8_ | (ulong)!bVar15 * (long)*pdVar2);
                pdVar2[1] = (double)((ulong)bVar16 * auVar32._8_8_ |
                                    (ulong)!bVar16 * (long)pdVar2[1]);
                pdVar2[2] = (double)((ulong)bVar17 * auVar32._16_8_ |
                                    (ulong)!bVar17 * (long)pdVar2[2]);
                pdVar2[3] = (double)((ulong)bVar18 * auVar32._24_8_ |
                                    (ulong)!bVar18 * (long)pdVar2[3]);
                pdVar2[4] = (double)((ulong)bVar19 * auVar32._32_8_ |
                                    (ulong)!bVar19 * (long)pdVar2[4]);
                pdVar2[5] = (double)((ulong)bVar20 * auVar32._40_8_ |
                                    (ulong)!bVar20 * (long)pdVar2[5]);
                pdVar2[6] = (double)((ulong)bVar21 * auVar32._48_8_ |
                                    (ulong)!bVar21 * (long)pdVar2[6]);
                pdVar2[7] = (double)((uVar27 >> 7) * auVar32._56_8_ |
                                    (ulong)!SUB81(uVar27 >> 7,0) * (long)pdVar2[7]);
                uVar25 = uVar25 + 8;
              } while ((((uint)local_c8.m_storage.m_rows & 7) + 7 & 0xfffffff8) != uVar25);
            }
            local_80 = 0;
            local_90 = (double *)0x0;
            pPStack_88 = (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0;
            local_b8._8_8_ = local_c8.m_storage.m_rows;
            local_b8._0_8_ = local_d8.m_storage.m_data;
            local_b8._16_8_ = 1;
            local_b8._24_8_ = 1;
            local_58.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            local_58.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows.m_value =
                 (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_rows;
            local_58.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value = 1;
            if (local_58.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value < 0 &&
                local_58.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_data != (double *)0x0) {
              __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                            ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                            "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                           );
            }
            local_58.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .m_stride.m_outer.m_value = 1;
            ChMatrixCorotation::ComputeCK
                      ((ChMatrixConstRef)local_b8,&(this->super_ChElementCorotational).A,4,&local_58
                      );
            if (local_90 != (double *)0x0) {
              free((void *)local_90[-1]);
            }
            if (local_70 != 0) {
              free(*(void **)(local_70 + -8));
            }
            if (local_d8.m_storage.m_data != (double *)0x0) {
              free((void *)local_d8.m_storage.m_data[-1]);
            }
            if (local_c8.m_storage.m_data != (double *)0x0) {
              free((void *)local_c8.m_storage.m_data[-1]);
            }
            return;
          }
        }
        pcVar26 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
        ;
      }
      else {
        pcVar26 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
        ;
      }
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar26);
    }
  }
  pcVar26 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_0069ceaa:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar26);
}

Assistant:

void ChElementTetraCorot_4::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 12);

    // set up vector of nodal displacements (in local element system) u_l = R*p - p0
    ChVectorDynamic<> displ(12);
    this->GetStateBlock(displ);  // nodal displacements, local

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> FiK_local = StiffnessMatrix * displ;

    displ.segment(0, 3) = (A.transpose() * nodes[0]->pos_dt).eigen();  // nodal speeds, local
    displ.segment(3, 3) = (A.transpose() * nodes[1]->pos_dt).eigen();
    displ.segment(6, 3) = (A.transpose() * nodes[2]->pos_dt).eigen();
    displ.segment(9, 3) = (A.transpose() * nodes[3]->pos_dt).eigen();
    ChMatrixDynamic<> FiR_local = Material->Get_RayleighDampingK() * StiffnessMatrix * displ;

    double lumped_node_mass = (this->GetVolume() * this->Material->Get_density()) / 4.0;
    displ *= lumped_node_mass * this->Material->Get_RayleighDampingM();
    FiR_local += displ;

    //***TO DO*** better per-node lumping, or 12x12 consistent mass matrix.

    FiK_local += FiR_local;
    FiK_local *= -1.0;

    // Fi = C * Fi_local  with C block-diagonal rotations A
    ChMatrixCorotation::ComputeCK(FiK_local, this->A, 4, Fi);
}